

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void __thiscall google::protobuf::CEscapeAndAppend(protobuf *this,StringPiece src,string *dest)

{
  protobuf pVar1;
  long lVar2;
  int i;
  char *pcVar3;
  long *plVar4;
  char *pcVar5;
  char *pcVar6;
  protobuf *ppVar7;
  char *pcVar8;
  
  plVar4 = (long *)src.length_;
  pcVar5 = src.ptr_;
  pcVar3 = (char *)0x0;
  pcVar8 = (char *)0x0;
  if (0 < (long)pcVar5) {
    pcVar8 = pcVar5;
  }
  pcVar6 = (char *)0x0;
  for (; pcVar8 != pcVar3; pcVar3 = pcVar3 + 1) {
    pcVar6 = pcVar6 + (char)CEscapedLength(google::protobuf::StringPiece)::c_escaped_len
                            [(byte)this[(long)pcVar3]];
  }
  if (pcVar6 == pcVar5) {
    std::__cxx11::string::append((char *)plVar4,(ulong)this);
    return;
  }
  lVar2 = plVar4[1];
  std::__cxx11::string::resize((ulong)plVar4);
  ppVar7 = (protobuf *)(lVar2 + *plVar4);
  pcVar3 = (char *)0x0;
  do {
    if (pcVar8 == pcVar3) {
      return;
    }
    pVar1 = this[(long)pcVar3];
    if (pVar1 == (protobuf)0x9) {
      *(undefined2 *)ppVar7 = 0x745c;
LAB_0028853d:
      ppVar7 = ppVar7 + 2;
    }
    else {
      if (pVar1 == (protobuf)0x5c) {
        *(undefined2 *)ppVar7 = 0x5c5c;
        goto LAB_0028853d;
      }
      if (pVar1 == (protobuf)0xd) {
        *(undefined2 *)ppVar7 = 0x725c;
        goto LAB_0028853d;
      }
      if (pVar1 == (protobuf)0x22) {
        *(undefined2 *)ppVar7 = 0x225c;
        goto LAB_0028853d;
      }
      if (pVar1 == (protobuf)0x27) {
        *(undefined2 *)ppVar7 = 0x275c;
        goto LAB_0028853d;
      }
      if (pVar1 == (protobuf)0xa) {
        *(undefined2 *)ppVar7 = 0x6e5c;
        goto LAB_0028853d;
      }
      if ((byte)((char)pVar1 - 0x20U) < 0x5f) {
        *ppVar7 = pVar1;
        ppVar7 = ppVar7 + 1;
      }
      else {
        *ppVar7 = (protobuf)0x5c;
        ppVar7[1] = (protobuf)((byte)pVar1 >> 6 | 0x30);
        ppVar7[2] = (protobuf)((byte)pVar1 >> 3 & 7 | 0x30);
        ppVar7[3] = (protobuf)((byte)pVar1 & 7 | 0x30);
        ppVar7 = ppVar7 + 4;
      }
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

void CEscapeAndAppend(StringPiece src, string* dest) {
  size_t escaped_len = CEscapedLength(src);
  if (escaped_len == src.size()) {
    dest->append(src.data(), src.size());
    return;
  }

  size_t cur_dest_len = dest->size();
  dest->resize(cur_dest_len + escaped_len);
  char* append_ptr = &(*dest)[cur_dest_len];

  for (int i = 0; i < src.size(); ++i) {
    unsigned char c = static_cast<unsigned char>(src[i]);
    switch (c) {
      case '\n': *append_ptr++ = '\\'; *append_ptr++ = 'n'; break;
      case '\r': *append_ptr++ = '\\'; *append_ptr++ = 'r'; break;
      case '\t': *append_ptr++ = '\\'; *append_ptr++ = 't'; break;
      case '\"': *append_ptr++ = '\\'; *append_ptr++ = '\"'; break;
      case '\'': *append_ptr++ = '\\'; *append_ptr++ = '\''; break;
      case '\\': *append_ptr++ = '\\'; *append_ptr++ = '\\'; break;
      default:
        if (!isprint(c)) {
          *append_ptr++ = '\\';
          *append_ptr++ = '0' + c / 64;
          *append_ptr++ = '0' + (c % 64) / 8;
          *append_ptr++ = '0' + c % 8;
        } else {
          *append_ptr++ = c;
        }
        break;
    }
  }
}